

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::PReLU_x86_avx2::forward_inplace(PReLU_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 *puVar3;
  long lVar4;
  _func_int **pp_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  undefined1 (*pauVar13) [32];
  undefined1 (*pauVar14) [16];
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  
  auVar20 = _DAT_003185c0;
  iVar9 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar9 == 3) {
      iVar9 = bottom_top_blob->c;
      if (0 < (long)iVar9) {
        iVar10 = bottom_top_blob->h * bottom_top_blob->w;
        pp_Var5 = this->_vptr_PReLU_x86_avx2;
        lVar12 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) < 2) {
            uVar2 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var5[-3]);
            auVar22._4_4_ = uVar2;
            auVar22._0_4_ = uVar2;
            auVar22._8_4_ = uVar2;
            auVar22._12_4_ = uVar2;
          }
          else {
            auVar22 = *(undefined1 (*) [16])
                       (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var5[-3]) + lVar12 * 4);
          }
          if (0 < iVar10) {
            pauVar14 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar12 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar15 = iVar10;
            do {
              auVar18 = vmaxps_avx(*pauVar14,ZEXT816(0) << 0x40);
              auVar21 = vminps_avx(*pauVar14,ZEXT816(0) << 0x40);
              auVar18 = vfmadd213ps_fma(auVar21,auVar22,auVar18);
              *pauVar14 = auVar18;
              pauVar14 = pauVar14 + 1;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != iVar9);
      }
    }
    else if (iVar9 == 2) {
      iVar9 = bottom_top_blob->h;
      if (0 < (long)iVar9) {
        iVar10 = bottom_top_blob->w;
        pp_Var5 = this->_vptr_PReLU_x86_avx2;
        lVar12 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) < 2) {
            uVar2 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var5[-3]);
            auVar21._4_4_ = uVar2;
            auVar21._0_4_ = uVar2;
            auVar21._8_4_ = uVar2;
            auVar21._12_4_ = uVar2;
          }
          else {
            auVar21 = *(undefined1 (*) [16])
                       (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var5[-3]) + lVar12 * 4);
          }
          if (0 < iVar10) {
            pauVar14 = (undefined1 (*) [16])
                       (bottom_top_blob->w * lVar12 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar15 = iVar10;
            do {
              auVar18 = vmaxps_avx(*pauVar14,ZEXT816(0) << 0x40);
              auVar22 = vminps_avx(*pauVar14,ZEXT816(0) << 0x40);
              auVar18 = vfmadd213ps_fma(auVar22,auVar21,auVar18);
              *pauVar14 = auVar18;
              pauVar14 = pauVar14 + 1;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != iVar9);
      }
    }
    else if (iVar9 == 1) {
      uVar11 = bottom_top_blob->w;
      puVar3 = *(undefined4 **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx2[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx2[-3]) < 2) {
        if (0 < (int)uVar11) {
          uVar2 = *puVar3;
          auVar18._4_4_ = uVar2;
          auVar18._0_4_ = uVar2;
          auVar18._8_4_ = uVar2;
          auVar18._12_4_ = uVar2;
          lVar12 = 0;
          do {
            auVar21 = *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar12);
            auVar22 = vmaxps_avx(auVar21,ZEXT816(0));
            auVar21 = vminps_avx(auVar21,ZEXT816(0));
            auVar21 = vfmadd213ps_fma(auVar21,auVar18,auVar22);
            *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar12) = auVar21;
            lVar12 = lVar12 + 0x10;
          } while ((ulong)uVar11 << 4 != lVar12);
        }
      }
      else if (0 < (int)uVar11) {
        lVar12 = 0;
        do {
          auVar18 = *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar12);
          auVar21 = vmaxps_avx(auVar18,ZEXT816(0));
          auVar18 = vminps_avx(auVar18,ZEXT816(0));
          auVar18 = vfmadd132ps_fma(auVar18,auVar21,*(undefined1 (*) [16])((long)puVar3 + lVar12));
          *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar12) = auVar18;
          lVar12 = lVar12 + 0x10;
        } while ((ulong)uVar11 << 4 != lVar12);
      }
    }
  }
  else if (bottom_top_blob->elempack == 8) {
    if (iVar9 == 3) {
      iVar9 = bottom_top_blob->c;
      if (0 < (long)iVar9) {
        iVar10 = bottom_top_blob->h * bottom_top_blob->w;
        pp_Var5 = this->_vptr_PReLU_x86_avx2;
        lVar12 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) < 2) {
            uVar2 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var5[-3]);
            auVar24._4_4_ = uVar2;
            auVar24._0_4_ = uVar2;
            auVar24._8_4_ = uVar2;
            auVar24._12_4_ = uVar2;
            auVar24._16_4_ = uVar2;
            auVar24._20_4_ = uVar2;
            auVar24._24_4_ = uVar2;
            auVar24._28_4_ = uVar2;
          }
          else {
            auVar24 = *(undefined1 (*) [32])
                       (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var5[-3]) + lVar12 * 8);
          }
          if (0 < iVar10) {
            pauVar13 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * lVar12 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar15 = iVar10;
            do {
              auVar20 = vmaxps_avx(*pauVar13,ZEXT1632(ZEXT816(0) << 0x40));
              auVar23 = vminps_avx(*pauVar13,ZEXT1632(ZEXT816(0) << 0x40));
              auVar18 = vfmadd213ps_fma(auVar23,auVar24,auVar20);
              *pauVar13 = ZEXT1632(auVar18);
              pauVar13 = pauVar13 + 1;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != iVar9);
      }
    }
    else if (iVar9 == 2) {
      iVar9 = bottom_top_blob->h;
      if (0 < (long)iVar9) {
        iVar10 = bottom_top_blob->w;
        pp_Var5 = this->_vptr_PReLU_x86_avx2;
        lVar12 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) < 2) {
            uVar2 = **(undefined4 **)(&this->field_0xd8 + (long)pp_Var5[-3]);
            auVar23._4_4_ = uVar2;
            auVar23._0_4_ = uVar2;
            auVar23._8_4_ = uVar2;
            auVar23._12_4_ = uVar2;
            auVar23._16_4_ = uVar2;
            auVar23._20_4_ = uVar2;
            auVar23._24_4_ = uVar2;
            auVar23._28_4_ = uVar2;
          }
          else {
            auVar23 = *(undefined1 (*) [32])
                       (*(undefined4 **)(&this->field_0xd8 + (long)pp_Var5[-3]) + lVar12 * 8);
          }
          if (0 < iVar10) {
            pauVar13 = (undefined1 (*) [32])
                       (bottom_top_blob->w * lVar12 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar15 = iVar10;
            do {
              auVar20 = vmaxps_avx(*pauVar13,ZEXT1632(ZEXT816(0) << 0x40));
              auVar24 = vminps_avx(*pauVar13,ZEXT1632(ZEXT816(0) << 0x40));
              auVar18 = vfmadd213ps_fma(auVar24,auVar23,auVar20);
              *pauVar13 = ZEXT1632(auVar18);
              pauVar13 = pauVar13 + 1;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != iVar9);
      }
    }
    else if (iVar9 == 1) {
      uVar11 = bottom_top_blob->w;
      puVar3 = *(undefined4 **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx2[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86_avx2[-3]) < 2) {
        if (0 < (int)uVar11) {
          uVar2 = *puVar3;
          auVar20._4_4_ = uVar2;
          auVar20._0_4_ = uVar2;
          auVar20._8_4_ = uVar2;
          auVar20._12_4_ = uVar2;
          auVar20._16_4_ = uVar2;
          auVar20._20_4_ = uVar2;
          auVar20._24_4_ = uVar2;
          auVar20._28_4_ = uVar2;
          lVar12 = 0;
          do {
            auVar23 = *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar12);
            auVar24 = vmaxps_avx(auVar23,ZEXT1632(ZEXT816(0)));
            auVar23 = vminps_avx(auVar23,ZEXT1632(ZEXT816(0)));
            auVar18 = vfmadd213ps_fma(auVar23,auVar20,auVar24);
            *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar12) = ZEXT1632(auVar18);
            lVar12 = lVar12 + 0x20;
          } while ((ulong)uVar11 << 5 != lVar12);
        }
      }
      else if (0 < (int)uVar11) {
        lVar12 = 0;
        do {
          auVar20 = *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar12);
          auVar23 = vmaxps_avx(auVar20,ZEXT1632(ZEXT816(0)));
          auVar20 = vminps_avx(auVar20,ZEXT1632(ZEXT816(0)));
          auVar18 = vfmadd132ps_fma(auVar20,auVar23,*(undefined1 (*) [32])((long)puVar3 + lVar12));
          *(undefined1 (*) [32])((long)bottom_top_blob->data + lVar12) = ZEXT1632(auVar18);
          lVar12 = lVar12 + 0x20;
        } while ((ulong)uVar11 << 5 != lVar12);
      }
    }
  }
  else {
    if (iVar9 != 3) {
      iVar9 = PReLU::forward_inplace
                        ((PReLU *)((long)&this->_vptr_PReLU_x86_avx2 +
                                  (long)this->_vptr_PReLU_x86_avx2[-3]),bottom_top_blob,opt);
      return iVar9;
    }
    iVar9 = bottom_top_blob->c;
    if (0 < (long)iVar9) {
      lVar4 = *(long *)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86_avx2[-3]);
      uVar11 = bottom_top_blob->h * bottom_top_blob->w;
      pp_Var5 = this->_vptr_PReLU_x86_avx2;
      lVar12 = (ulong)(uVar11 & 7) - 1;
      auVar26._8_8_ = lVar12;
      auVar26._0_8_ = lVar12;
      auVar26._16_8_ = lVar12;
      auVar26._24_8_ = lVar12;
      auVar24 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar8 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar25._8_8_ = 0x8000000000000000;
      auVar25._0_8_ = 0x8000000000000000;
      auVar25._16_8_ = 0x8000000000000000;
      auVar25._24_8_ = 0x8000000000000000;
      auVar23 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
      uVar17 = 0;
      do {
        pauVar13 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar17 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar16 = uVar17 & 0xffffffff;
        if (*(int *)(&this->field_0xd0 + (long)pp_Var5[-3]) < 2) {
          uVar16 = 0;
        }
        fVar1 = *(float *)(lVar4 + uVar16 * 4);
        auVar19 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if (0 < (int)uVar11 >> 3) {
          auVar28._4_4_ = fVar1;
          auVar28._0_4_ = fVar1;
          auVar28._8_4_ = fVar1;
          auVar28._12_4_ = fVar1;
          auVar28._16_4_ = fVar1;
          auVar28._20_4_ = fVar1;
          auVar28._24_4_ = fVar1;
          auVar28._28_4_ = fVar1;
          iVar10 = ((int)uVar11 >> 3) + 1;
          do {
            auVar6 = vmaxps_avx(*pauVar13,auVar19);
            auVar7 = vminps_avx(*pauVar13,auVar19);
            auVar18 = vfmadd213ps_fma(auVar7,auVar28,auVar6);
            *pauVar13 = ZEXT1632(auVar18);
            pauVar13 = pauVar13 + 1;
            iVar10 = iVar10 + -1;
          } while (1 < iVar10);
        }
        if ((uVar11 & 7) != 0) {
          uVar16 = 0;
          do {
            auVar27._8_8_ = uVar16;
            auVar27._0_8_ = uVar16;
            auVar27._16_8_ = uVar16;
            auVar27._24_8_ = uVar16;
            auVar6 = vpor_avx2(auVar27,auVar24);
            auVar28 = vpor_avx2(auVar27,auVar8);
            auVar28 = vpcmpgtq_avx2(auVar28 ^ auVar25,auVar26 ^ auVar25);
            auVar6 = vpcmpgtq_avx2(auVar6 ^ auVar25,auVar26 ^ auVar25);
            auVar28 = vpackssdw_avx2(auVar6,auVar28);
            auVar18 = vpackssdw_avx(SUB3216(auVar28 ^ auVar23,0),SUB3216(auVar28 ^ auVar23,0x10));
            auVar18 = vpshufd_avx(auVar18,0xd8);
            auVar28 = vpmovzxwd_avx2(auVar18);
            auVar28 = vpslld_avx2(auVar28,0x1f);
            auVar6 = vmaskmovps_avx(auVar28,*(undefined1 (*) [32])(*pauVar13 + uVar16 * 4));
            auVar28 = vcmpps_avx(auVar6,auVar19,1);
            auVar28 = vpshufb_avx2(auVar28,auVar20);
            auVar28 = vpermq_avx2(auVar28,0xe8);
            auVar18 = vpand_avx(auVar18,auVar28._0_16_);
            auVar28 = vpmovzxwd_avx2(auVar18);
            auVar28 = vpslld_avx2(auVar28,0x1f);
            auVar7._4_4_ = auVar6._4_4_ * fVar1;
            auVar7._0_4_ = auVar6._0_4_ * fVar1;
            auVar7._8_4_ = auVar6._8_4_ * fVar1;
            auVar7._12_4_ = auVar6._12_4_ * fVar1;
            auVar7._16_4_ = auVar6._16_4_ * fVar1;
            auVar7._20_4_ = auVar6._20_4_ * fVar1;
            auVar7._24_4_ = auVar6._24_4_ * fVar1;
            auVar7._28_4_ = auVar6._28_4_;
            auVar28 = vmaskmovps_avx(auVar28,auVar7);
            *(undefined1 (*) [32])(*pauVar13 + uVar16 * 4) = auVar28;
            uVar16 = uVar16 + 8;
          } while (((uVar11 & 7) + 7 & 0xfffffff8) != uVar16);
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != (long)iVar9);
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _slope = _mm256_loadu_ps(slope + i * 8);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
            else
            {
                __m256 _slope = _mm256_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _slope = _mm_loadu_ps(slope + i * 4);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
            else
            {
                __m128 _slope = _mm_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return PReLU::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    const float* slope_data_ptr = slope_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        float slope = num_slope > 1 ? slope_data_ptr[q] : slope_data_ptr[0];

#if __AVX__
        int nn = size >> 3;
        int remain = size - (nn << 3);
#else
        int remain = size;
#endif // __AVX__

#if __AVX__
        for (; nn > 0; nn--)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, prelu_avx(_p, _mm256_set1_ps(slope)));
            ptr += 8;
        }
#endif // __AVX__
        for (; remain > 0; remain--)
        {
            if (*ptr < 0)
                *ptr *= slope;

            ptr++;
        }
    }

    return 0;
}